

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O0

void __thiscall tcu::ThreadUtil::Thread::run(Thread *this)

{
  size_type sVar1;
  reference ppOVar2;
  NotSupportedError *e;
  Exception *e_1;
  exception *error;
  int local_28;
  int operationNdx;
  bool initOk;
  Thread *this_local;
  
  this->m_status = THREADSTATUS_RUNNING;
  sVar1 = std::vector<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>::
          size(&this->m_operations);
  std::vector<tcu::ThreadUtil::Message,_std::allocator<tcu::ThreadUtil::Message>_>::reserve
            (&this->m_messages,sVar1 * 2);
  (*(this->super_Thread)._vptr_Thread[3])();
  local_28 = 0;
  while( true ) {
    sVar1 = std::vector<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>
            ::size(&this->m_operations);
    if ((int)sVar1 <= local_28) break;
    ppOVar2 = std::
              vector<tcu::ThreadUtil::Operation_*,_std::allocator<tcu::ThreadUtil::Operation_*>_>::
              operator[](&this->m_operations,(long)local_28);
    (*(*ppOVar2)->_vptr_Operation[3])(*ppOVar2,this);
    local_28 = local_28 + 1;
  }
  (*(this->super_Thread)._vptr_Thread[4])();
  this->m_status = THREADSTATUS_READY;
  return;
}

Assistant:

void Thread::run (void)
{
	m_status = THREADSTATUS_RUNNING;
	bool initOk = false;

	// Reserve at least two messages for each operation
	m_messages.reserve(m_operations.size()*2);
	try
	{
		init();
		initOk = true;
		for (int operationNdx = 0; operationNdx < (int)m_operations.size(); operationNdx++)
			m_operations[operationNdx]->execute(*this);

		deinit();
		m_status =  THREADSTATUS_READY;
	}
	catch (const tcu::NotSupportedError& e)
	{
		newMessage() << "tcu::NotSupportedError '" << e.what() << "'" << Message::End;
		deinit();
		m_status = (initOk ? THREADSTATUS_NOT_SUPPORTED : THREADSTATUS_INIT_FAILED);
	}
	catch (const tcu::Exception& e)
	{
		newMessage() << "tcu::Exception '" << e.what() << "'" << Message::End;
		deinit();
		m_status = (initOk ? THREADSTATUS_FAILED : THREADSTATUS_INIT_FAILED);
	}
	catch (const std::exception& error)
	{
		newMessage() << "std::exception '" << error.what() << "'" << Message::End;
		deinit();
		m_status = (initOk ? THREADSTATUS_FAILED : THREADSTATUS_INIT_FAILED);
	}
	catch (...)
	{
		newMessage() << "Unkown exception" << Message::End;
		deinit();
		m_status = (initOk ? THREADSTATUS_FAILED : THREADSTATUS_INIT_FAILED);
	}
}